

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result wabt::TypeChecker::CheckType(Type actual,Type expected)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  if (actual.enum_ == Any || expected.enum_ == Any) {
    return (Result)Ok;
  }
  if (expected.enum_ != actual.enum_) {
    uVar1 = expected.enum_ + ~(Func|I32U);
    bVar3 = (byte)(0x40001c1 >> ((byte)uVar1 & 0x1f)) & uVar1 < 0x1b;
    uVar2 = actual.enum_ + ~(Func|I32U);
    if ((uVar2 < 0x1b) && ((0x40001c1U >> (uVar2 & 0x1f) & 1) != 0)) {
      if (bVar3 == 0) {
        return (Result)Error;
      }
    }
    else if (bVar3 != 0) {
      return (Result)Error;
    }
    switch(uVar1) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      break;
    case 7:
      if ((uVar2 < 0x1b) && ((0x40001c1U >> (uVar2 & 0x1f) & 1) != 0)) {
        return (Result)Ok;
      }
      break;
    default:
      if (expected.enum_ != Hostref) {
        return (Result)Error;
      }
    case 0:
    case 6:
    case 8:
      if (actual.enum_ == Nullref) {
        return (Result)Ok;
      }
    }
    return (Result)Error;
  }
  return (Result)Ok;
}

Assistant:

Result TypeChecker::CheckType(Type actual, Type expected) {
  if (expected == Type::Any || actual == Type::Any) {
    return Result::Ok;
  }

  if (!IsSubtype(actual, expected)) {
    return Result::Error;
  }

  return Result::Ok;
}